

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O2

VkSamplerBorderColorComponentMappingCreateInfoEXT * __thiscall
Fossilize::StateRecorder::Impl::copy<VkSamplerBorderColorComponentMappingCreateInfoEXT>
          (Impl *this,VkSamplerBorderColorComponentMappingCreateInfoEXT *src,size_t count,
          ScratchAllocator *alloc)

{
  VkSamplerBorderColorComponentMappingCreateInfoEXT *pVVar1;
  
  if (count != 0) {
    pVVar1 = ScratchAllocator::allocate_n<VkSamplerBorderColorComponentMappingCreateInfoEXT>
                       (alloc,count);
    if (pVVar1 != (VkSamplerBorderColorComponentMappingCreateInfoEXT *)0x0) {
      pVVar1 = (VkSamplerBorderColorComponentMappingCreateInfoEXT *)memmove(pVVar1,src,count * 0x28)
      ;
      return pVVar1;
    }
  }
  return (VkSamplerBorderColorComponentMappingCreateInfoEXT *)0x0;
}

Assistant:

T *StateRecorder::Impl::copy(const T *src, size_t count, ScratchAllocator &alloc)
{
	if (!count)
		return nullptr;

	auto *new_data = alloc.allocate_n<T>(count);
	if (new_data)
		std::copy(src, src + count, new_data);
	return new_data;
}